

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storing.c
# Opt level: O1

int store_all_pathways_db(FILE *fp,feed_db_t *db)

{
  int iVar1;
  uint fields_number;
  feed_db_status_t fVar2;
  int iVar3;
  int iVar4;
  size_t i_2;
  char **ppcVar5;
  size_t i_1;
  size_t i_3;
  int iVar6;
  size_t i;
  ulong uVar7;
  bool bVar8;
  char **field_names;
  char **record_values;
  pathway_t record;
  char **local_240;
  char **local_238;
  feed_db_t *local_230;
  int local_224;
  FILE *local_220;
  pathway_t local_218;
  
  local_238 = (char **)0x0;
  local_230 = db;
  iVar1 = count_lines(fp);
  local_240 = (char **)0x0;
  local_220 = fp;
  fields_number = read_header(fp,&local_240);
  ppcVar5 = local_240;
  if ((int)fields_number < 0) {
    iVar4 = -1;
    if (local_240 == (char **)0x0) {
      return -1;
    }
  }
  else {
    if (iVar1 < 2) {
      if (local_240 != (char **)0x0) {
        if (fields_number != 0) {
          uVar7 = 0;
          do {
            free(ppcVar5[uVar7]);
            uVar7 = uVar7 + 1;
          } while (fields_number != uVar7);
        }
        free(ppcVar5);
      }
      free(local_238);
      return -(uint)(iVar1 != 1);
    }
    fVar2 = begin_transaction_db(local_230);
    ppcVar5 = local_240;
    if (fVar2 == FEED_DB_ERROR) {
      iVar4 = -1;
      if (local_240 == (char **)0x0) {
        return -1;
      }
      if (fields_number != 0) {
        uVar7 = 0;
        do {
          free(ppcVar5[uVar7]);
          uVar7 = uVar7 + 1;
        } while (fields_number != uVar7);
      }
    }
    else {
      iVar1 = iVar1 + -2;
      iVar4 = 0;
      iVar6 = 0;
      local_224 = iVar1;
      do {
        iVar3 = read_record(local_220,fields_number,&local_238);
        if (0 < iVar3) {
          read_pathway(&local_218,fields_number,local_240,local_238);
          fVar2 = store_pathway_db(&local_218,local_230);
          if (fVar2 != FEED_DB_SUCCESS) break;
          iVar4 = iVar4 + 1;
        }
        ppcVar5 = local_238;
        if (local_238 != (char **)0x0) {
          if (fields_number != 0) {
            uVar7 = 0;
            do {
              free(ppcVar5[uVar7]);
              uVar7 = uVar7 + 1;
            } while (fields_number != uVar7);
          }
          free(ppcVar5);
          iVar1 = local_224;
        }
        bVar8 = iVar6 != iVar1;
        iVar6 = iVar6 + 1;
      } while (bVar8);
      end_transaction_db(local_230);
      ppcVar5 = local_240;
      if (local_240 == (char **)0x0) {
        return iVar4;
      }
      if (fields_number != 0) {
        uVar7 = 0;
        do {
          free(ppcVar5[uVar7]);
          uVar7 = uVar7 + 1;
        } while (fields_number != uVar7);
      }
    }
  }
  free(ppcVar5);
  return iVar4;
}

Assistant:

int store_all_pathways_db(FILE *fp, feed_db_t *db) {

    pathway_t record;
    feed_db_status_t res;

    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }

    if (lines_count < 1) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return (lines_count < 0) ? -1 : 0;
    }

    #ifndef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    if ((res = begin_transaction_db(db)) == FEED_DB_ERROR) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }
    #endif

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            read_pathway(&record, field_count, (const char **)field_names, (const char **)record_values);
            res = store_pathway_db(&record, db);

            // free_cstr_arr(record_values, field_count);

            if (res == FEED_DB_SUCCESS)
                record_count++;
            else
                break;
        }
        free_cstr_arr(record_values, field_count);
    }

    #ifndef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    end_transaction_db(db);
    #endif

    free_cstr_arr(field_names, field_count);
    return record_count;
}